

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DerTypes.h
# Opt level: O1

bool __thiscall
DerBase::Decode<std::__cxx11::wstring>
          (DerBase *this,uchar *pIn,size_t cbIn,DerType type,size_t *cbUsed,
          basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *value)

{
  pointer pwVar1;
  bool bVar2;
  out_of_range *this_00;
  size_t sVar3;
  size_t local_40;
  size_t size;
  
  local_40 = 0;
  size = 0;
  value->_M_string_length = 0;
  pwVar1 = (value->_M_dataplus)._M_p;
  *pwVar1 = L'\0';
  if ((cbIn < 3) || (-1 < (char)*pIn && *pIn != (uchar)type)) {
    if ((cbIn != 2) || (pIn[1] != '\0')) {
      if (((cbIn < 2) || (*pIn != '\x05')) || (pIn[1] != '\0')) {
        sVar3 = 0;
        bVar2 = false;
      }
      else {
        bVar2 = true;
        sVar3 = 2;
      }
      *cbUsed = sVar3;
      return bVar2;
    }
    local_40 = 2;
    sVar3 = 2;
  }
  else {
    bVar2 = DecodeSize(pIn + 1,cbIn - 1,&local_40,&size);
    if ((!bVar2) || (sVar3 = size + 1, cbIn < local_40 + sVar3)) {
      this_00 = (out_of_range *)__cxa_allocate_exception(0x10);
      std::out_of_range::out_of_range(this_00,"Illegal size value");
      __cxa_throw(this_00,&std::out_of_range::typeinfo,std::out_of_range::~out_of_range);
    }
  }
  *cbUsed = sVar3 + local_40;
  size = sVar3;
  std::__cxx11::wstring::_M_replace_dispatch<unsigned_char_const*>
            ((wstring *)value,pwVar1,pwVar1,pIn + sVar3,pIn + sVar3 + local_40);
  this->cbData = value->_M_string_length;
  return true;
}

Assistant:

bool Decode(const unsigned char* pIn, size_t cbIn, const DerType type, size_t& cbUsed, T& value)
	{
		size_t size = 0;
		size_t cbPrefix = 0;

		value.clear();

		if (!CheckDecode(pIn, cbIn, type, size, cbPrefix))
		{
			// Allow Null, will correctly set cbUsed
			return DecodeNull(pIn, cbIn, cbUsed);
		}

		cbUsed = cbPrefix + static_cast<size_t>(size);
		value.insert(value.begin(), pIn + cbPrefix, pIn + cbUsed);
		cbData = value.size();
		return true;
	}